

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::bt_peer_connection
          (bt_peer_connection *this,peer_connection_args *pack)

{
  undefined8 uVar1;
  
  peer_connection::peer_connection(&this->super_peer_connection,pack);
  (this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket =
       (_func_int **)&PTR_assign_bandwidth_004dee60;
  (this->super_peer_connection).super_disk_observer._vptr_disk_observer =
       (_func_int **)&DAT_004df018;
  (this->super_peer_connection).super_peer_connection_interface._vptr_peer_connection_interface =
       (_func_int **)&PTR_destination_abi_cxx11__004df030;
  *(undefined2 *)&(this->super_peer_connection).field_0x888 = 7;
  (this->m_recv_buffer).m_recv_pos = 0x7fffffff;
  (this->m_recv_buffer).m_packet_size = 0;
  (this->m_recv_buffer).m_connection_buffer = &(this->super_peer_connection).m_recv_buffer;
  (this->m_client_version)._M_dataplus._M_p = (pointer)&(this->m_client_version).field_2;
  (this->m_client_version)._M_string_length = 0;
  (this->m_client_version).field_2._M_local_buf[0] = '\0';
  uVar1 = *(undefined8 *)((pack->our_peer_id).m_number._M_elems + 2);
  *(undefined8 *)(this->m_our_peer_id).m_number._M_elems =
       *(undefined8 *)(pack->our_peer_id).m_number._M_elems;
  *(undefined8 *)((this->m_our_peer_id).m_number._M_elems + 2) = uVar1;
  (this->m_our_peer_id).m_number._M_elems[4] = (pack->our_peer_id).m_number._M_elems[4];
  (this->m_payloads).
  super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_payloads).
  super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_payloads).
  super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_hash_requests).
  super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hash_requests).
  super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_hash_requests).
  super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dh_key_exchange)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::dh_key_exchange,_std::default_delete<libtorrent::aux::dh_key_exchange>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::dh_key_exchange_*,_std::default_delete<libtorrent::aux::dh_key_exchange>_>
  .super__Head_base<0UL,_libtorrent::aux::dh_key_exchange_*,_false>._M_head_impl =
       (dh_key_exchange *)0x0;
  (this->m_rc4).super___shared_ptr<libtorrent::aux::rc4_handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_rc4).super___shared_ptr<libtorrent::aux::rc4_handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_enc_handler).m_send_barriers.
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_enc_handler;
  (this->m_enc_handler).m_send_barriers.
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_enc_handler;
  (this->m_ut_pex).super___weak_ptr<libtorrent::aux::ut_pex_peer_store,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_ut_pex).super___weak_ptr<libtorrent::aux::ut_pex_peer_store,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sync_hash)._M_t.
  super___uniq_ptr_impl<libtorrent::digest32<160L>,_std::default_delete<libtorrent::digest32<160L>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::digest32<160L>_*,_std::default_delete<libtorrent::digest32<160L>_>_>
  .super__Head_base<0UL,_libtorrent::digest32<160L>_*,_false>._M_head_impl = (digest32<160L> *)0x0;
  this->m_sync_bytes_read = 0;
  this->m_upload_only_id = '\0';
  this->m_holepunch_id = '\0';
  this->m_dont_have_id = '\0';
  this->m_share_mode_id = '\0';
  (this->m_enc_handler).m_dec_handler.
  super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sync_vc)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->m_enc_handler).m_send_barriers.
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_enc_handler).m_dec_handler.
  super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  peer_connection::peer_log(&this->super_peer_connection,info,"CONSTRUCT","bt_peer_connection");
  *(undefined8 *)(this->m_reserved_bits)._M_elems = 0;
  return;
}

Assistant:

bt_peer_connection::bt_peer_connection(peer_connection_args& pack)
		: peer_connection(pack)
		, m_supports_extensions(false)
		, m_supports_dht_port(false)
		, m_supports_fast(false)
		, m_sent_bitfield(false)
		, m_sent_handshake(false)
		, m_sent_allowed_fast(false)
#if !defined TORRENT_DISABLE_ENCRYPTION
		, m_encrypted(false)
		, m_rc4_encrypted(false)
		, m_recv_buffer(peer_connection::m_recv_buffer)
#endif
		, m_our_peer_id(pack.our_peer_id)
	{
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "CONSTRUCT", "bt_peer_connection");
#endif

		m_reserved_bits.fill(0);
	}